

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.h
# Opt level: O0

void __thiscall arangodb::velocypack::Parser::ParsedNumber::addDigit(ParsedNumber *this,int i)

{
  ulong uVar1;
  bool bVar2;
  uint uVar3;
  Exception *this_00;
  int in_ESI;
  ulong *in_RDI;
  undefined1 auVar4 [16];
  ExceptionType in_stack_ffffffffffffffdc;
  
  if ((in_RDI[2] & 1) != 0) {
    if ((*in_RDI < 0x1999999999999999) || ((*in_RDI == 0x1999999999999999 && (in_ESI + -0x30 < 6))))
    {
      *in_RDI = *in_RDI * 10 + (long)(in_ESI + -0x30);
      return;
    }
    uVar1 = *in_RDI;
    auVar4._8_4_ = (int)(uVar1 >> 0x20);
    auVar4._0_8_ = uVar1;
    auVar4._12_4_ = 0x45300000;
    in_RDI[1] = (ulong)((auVar4._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0));
    *(undefined1 *)(in_RDI + 2) = 0;
  }
  in_RDI[1] = (ulong)((double)in_RDI[1] * 10.0 + (double)(in_ESI + -0x30));
  uVar3 = std::isnan((double)in_RDI[1]);
  if (((uVar3 & 1) == 0) && (bVar2 = std::isfinite((double)in_RDI[1]), bVar2)) {
    return;
  }
  this_00 = (Exception *)__cxa_allocate_exception(0x18);
  Exception::Exception(this_00,in_stack_ffffffffffffffdc);
  __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

void addDigit(int i) {
      if (isInteger) {
        // check if adding another digit to the int will make it overflow
        if (intValue < 1844674407370955161ULL ||
            (intValue == 1844674407370955161ULL && (i - '0') <= 5)) {
          // int won't overflow
          intValue = intValue * 10 + (i - '0');
          return;
        }
        // int would overflow
        doubleValue = static_cast<double>(intValue);
        isInteger = false;
      }

      doubleValue = doubleValue * 10.0 + (i - '0');
      if (std::isnan(doubleValue) || !std::isfinite(doubleValue)) {
        throw Exception(Exception::NumberOutOfRange);
      }
    }